

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O3

int corpus_set_partition(uint32 part,uint32 parts)

{
  lineiter_t *plVar1;
  int iVar2;
  uint32 run_len;
  uint uVar3;
  
  if (ctl_fp == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
            ,0x21c,"Control file has not been set\n");
    iVar2 = -1;
  }
  else {
    plVar1 = lineiter_start(ctl_fp);
    iVar2 = 0;
    uVar3 = 0;
    if (plVar1 != (lineiter_t *)0x0) {
      uVar3 = 0;
      do {
        uVar3 = uVar3 + 1;
        plVar1 = lineiter_next(plVar1);
      } while (plVar1 != (lineiter_t *)0x0);
    }
    fseek((FILE *)ctl_fp,0,0);
    plVar1 = lineiter_start(ctl_fp);
    lineiter_free(plVar1);
    run_len = 0xffffffff;
    if (part != parts) {
      run_len = uVar3 / parts;
    }
    corpus_set_interval((part - 1) * (uVar3 / parts),run_len);
  }
  return iVar2;
}

Assistant:

int
corpus_set_partition(uint32 part,
		     uint32 parts)
{
    uint32 run_len;
    uint32 n_skip;
    int lineno = 0;
    lineiter_t* li;

    if (ctl_fp == NULL) {
	E_ERROR("Control file has not been set\n");

	return S3_ERROR;
    }

    for (li = lineiter_start(ctl_fp); li; li = lineiter_next(li)) {
	lineno++;
    }

    fseek(ctl_fp, 0L, SEEK_SET);
    
    li = lineiter_start(ctl_fp);
    lineiter_free(li);
    
    run_len = lineno / parts;

    n_skip = (part - 1) * run_len;

    if (part == parts)
	run_len = UNTIL_EOF;

    return corpus_set_interval(n_skip, run_len);
}